

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O0

Vec_Int_t * Llb_Nonlin4CreateVars2Q(DdManager *dd,Aig_Man_t *pAig,Vec_Int_t *vOrder,int fBackward)

{
  int iVar1;
  Vec_Int_t *p;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *local_70;
  int local_44;
  int i;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Vec_Int_t *vVars2Q;
  int fBackward_local;
  Vec_Int_t *vOrder_local;
  Aig_Man_t *pAig_local;
  DdManager *dd_local;
  
  p = Vec_IntAlloc(0);
  iVar1 = Cudd_ReadSize(dd);
  Vec_IntFill(p,iVar1,1);
  for (local_44 = 0; iVar1 = Saig_ManRegNum(pAig), local_44 < iVar1; local_44 = local_44 + 1) {
    local_70 = Saig_ManLi(pAig,local_44);
    pAVar2 = Saig_ManLo(pAig,local_44);
    if (fBackward != 0) {
      local_70 = pAVar2;
    }
    iVar1 = Llb_ObjBddVar(vOrder,local_70);
    Vec_IntWriteEntry(p,iVar1,0);
  }
  return p;
}

Assistant:

Vec_Int_t * Llb_Nonlin4CreateVars2Q( DdManager * dd, Aig_Man_t * pAig, Vec_Int_t * vOrder, int fBackward )
{
    Vec_Int_t * vVars2Q;
    Aig_Obj_t * pObjLi, * pObjLo;
    int i;
    vVars2Q = Vec_IntAlloc( 0 );
    Vec_IntFill( vVars2Q, Cudd_ReadSize(dd), 1 );
    Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )
        Vec_IntWriteEntry( vVars2Q, Llb_ObjBddVar(vOrder, fBackward ? pObjLo : pObjLi), 0 );
    return vVars2Q;
}